

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O3

boolean clear_stale_map(char oclass,uint material)

{
  monst *pmVar1;
  boolean bVar2;
  uint uVar3;
  long lVar4;
  obj *poVar5;
  ulong uVar6;
  obj *poVar7;
  ulong uVar8;
  level *plVar9;
  
  uVar6 = (ulong)material;
  lVar4 = 1;
  bVar2 = '\0';
  plVar9 = level;
  do {
    uVar8 = 0;
    do {
      uVar3 = *(uint *)(plVar9->locations[lVar4] + uVar8) >> 0xb & 0x3ff;
      if (uVar3 != 0) {
        if (oclass == '\x14') {
          if ((plVar9->objects[lVar4][uVar8] == (obj *)0x0) &&
             (((pmVar1 = plVar9->monsters[lVar4][uVar8], pmVar1 == (monst *)0x0 ||
               ((pmVar1->field_0x61 & 2) != 0)) || (pmVar1->minvent == (obj *)0x0)))) {
LAB_0016001b:
            uVar6 = uVar8 & 0xffffffff;
            unmap_object((int)lVar4,(int)uVar8);
            bVar2 = '\x01';
            plVar9 = level;
          }
        }
        else if ((material == 0) ||
                ((*(ushort *)&objects[(ulong)uVar3 - 1].field_0x11 >> 4 & 0x1f) != material)) {
          if ((oclass != '\0') && (objects[(ulong)uVar3 - 1].oc_class == oclass)) {
            for (poVar7 = plVar9->objects[lVar4][uVar8]; poVar7 != (obj *)0x0;
                poVar7 = (poVar7->v).v_nexthere) {
              uVar6 = (ulong)(uint)(int)oclass;
              poVar5 = o_in(poVar7,oclass);
              if (poVar5 != (obj *)0x0) goto LAB_00160039;
            }
            pmVar1 = plVar9->monsters[lVar4][uVar8];
            if ((pmVar1 == (monst *)0x0) || ((pmVar1->field_0x61 & 2) != 0)) goto LAB_0016001b;
            poVar7 = (obj *)&pmVar1->minvent;
            do {
              poVar7 = poVar7->nobj;
              if (poVar7 == (obj *)0x0) goto LAB_0016001b;
              uVar6 = (ulong)(uint)(int)oclass;
              poVar5 = o_in(poVar7,oclass);
            } while (poVar5 == (obj *)0x0);
          }
        }
        else {
          for (poVar7 = plVar9->objects[lVar4][uVar8]; poVar7 != (obj *)0x0;
              poVar7 = (poVar7->v).v_nexthere) {
            poVar5 = o_material(poVar7,(uint)uVar6);
            if (poVar5 != (obj *)0x0) goto LAB_00160039;
          }
          pmVar1 = plVar9->monsters[lVar4][uVar8];
          if ((pmVar1 == (monst *)0x0) || ((pmVar1->field_0x61 & 2) != 0)) goto LAB_0016001b;
          poVar7 = (obj *)&pmVar1->minvent;
          do {
            poVar7 = poVar7->nobj;
            if (poVar7 == (obj *)0x0) goto LAB_0016001b;
            poVar5 = o_material(poVar7,(uint)uVar6);
          } while (poVar5 == (obj *)0x0);
        }
      }
LAB_00160039:
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x15);
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x50) {
      return bVar2;
    }
  } while( true );
}

Assistant:

static boolean clear_stale_map(char oclass, unsigned material)
{
	int zx, zy;
	boolean change_made = FALSE;

	for (zx = 1; zx < COLNO; zx++)
	    for (zy = 0; zy < ROWNO; zy++)
		if (check_map_spot(zx, zy, oclass,material)) {
		    unmap_object(zx, zy);
		    change_made = TRUE;
		}

	return change_made;
}